

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poptconfig.c
# Opt level: O2

int poptReadConfigFile(poptContext con,char *fn)

{
  size_t sVar1;
  char **ppcVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  byte *pbVar7;
  ushort **ppuVar8;
  size_t sVar9;
  char *pcVar10;
  ulong uVar11;
  byte bVar12;
  byte *pbVar13;
  byte *pbVar14;
  uint uVar15;
  byte *__pattern;
  byte *pbVar16;
  byte *__ptr;
  uint local_d0;
  size_t nb_1;
  char *b_1;
  byte *local_b0;
  byte *local_a8;
  ulong local_a0;
  poptContext local_98;
  char *b;
  poptItem_s local_88;
  byte *local_48;
  byte *local_40;
  size_t nb;
  
  b = (char *)0x0;
  nb = 0;
  iVar4 = poptReadFile(fn,&b,&nb,1);
  sVar1 = nb;
  __ptr = (byte *)b;
  if (iVar4 != 0) {
    piVar6 = __errno_location();
    if (*piVar6 != 2) {
      return iVar4;
    }
    return 0;
  }
  iVar4 = 0;
  if (nb == 0 || b == (char *)0x0) {
    iVar4 = -0x16;
  }
  else {
    pbVar7 = (byte *)malloc(nb + 1);
    if (pbVar7 != (byte *)0x0) {
      pbVar16 = (byte *)((char *)__ptr + sVar1);
      local_40 = pbVar7 + 1;
      local_48 = pbVar7 + 2;
      __pattern = pbVar7;
      local_b0 = pbVar16;
      local_a8 = pbVar7;
      local_98 = con;
LAB_001051e5:
      if (__ptr < pbVar16) {
        bVar3 = *__ptr;
        if (bVar3 == 0x5c) {
          __ptr = __ptr + 1;
          *__pattern = 0x5c;
          if ((__ptr < pbVar16) && (*__ptr != 10)) {
            __pattern[1] = *__ptr;
            __pattern = __pattern + 2;
          }
        }
        else if (bVar3 == 10) {
          *__pattern = 0;
          pbVar13 = local_40;
          pbVar14 = local_48;
          __pattern = pbVar7;
          while( true ) {
            bVar3 = *__pattern;
            uVar11 = (ulong)bVar3;
            pbVar7 = local_a8;
            pbVar16 = local_b0;
            if (uVar11 == 0) break;
            ppuVar8 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar8 + uVar11 * 2 + 1) & 0x20) == 0) {
              pbVar7 = local_a8;
              pbVar16 = local_b0;
              if (bVar3 != 0x23) {
                b_1 = (char *)0x0;
                nb_1 = 0;
                pcVar10 = local_98->appName;
                if (pcVar10 == (char *)0x0) goto LAB_0010530a;
                local_88._48_8_ = 0;
                local_88.argv = (char **)0x0;
                local_88.option.descrip = (char *)0x0;
                local_88.option.argDescrip = (char *)0x0;
                local_88.option.arg = (void *)0x0;
                local_88.option.val = 0;
                local_88.option._28_4_ = 0;
                local_88.option.longName = (char *)0x0;
                local_88.option.shortName = '\0';
                local_88.option._9_3_ = 0;
                local_88.option.argInfo = 0;
                pbVar7 = __pattern;
                goto LAB_001052bd;
              }
              break;
            }
            __pattern = __pattern + 1;
            pbVar13 = pbVar13 + 1;
            pbVar14 = pbVar14 + 1;
          }
        }
        else {
          *__pattern = bVar3;
          __pattern = __pattern + 1;
        }
        goto LAB_0010531e;
      }
      iVar4 = 0;
      __ptr = (byte *)b;
      goto LAB_00105679;
    }
  }
  pbVar7 = (byte *)0x0;
LAB_00105679:
  free(pbVar7);
  free(__ptr);
  return iVar4;
LAB_001052bd:
  if ((char)uVar11 == '\0') goto LAB_0010530a;
  if ((*(byte *)((long)*ppuVar8 + uVar11 * 2 + 1) & 0x20) != 0) {
    *pbVar7 = 0;
    iVar4 = glob_pattern_p((char *)__pattern,1);
    if (iVar4 == 0) {
      iVar4 = strcmp((char *)__pattern,pcVar10);
    }
    else {
      iVar4 = fnmatch((char *)__pattern,pcVar10,5);
    }
    if (iVar4 == 0) goto LAB_00105326;
    goto LAB_0010530a;
  }
  uVar11 = (ulong)pbVar7[1];
  pbVar7 = pbVar7 + 1;
  pbVar13 = pbVar13 + 1;
  pbVar14 = pbVar14 + 1;
  goto LAB_001052bd;
  while( true ) {
    pbVar13 = pbVar7 + 1;
    pbVar14 = pbVar16 + 1;
    if ((*(byte *)((long)*ppuVar8 + uVar11 * 2 + 1) & 0x20) == 0) break;
LAB_00105326:
    pbVar16 = pbVar14;
    pbVar7 = pbVar13;
    uVar11 = (ulong)*pbVar7;
    if (uVar11 == 0) break;
  }
  do {
    if ((char)uVar11 == '\0') break;
    if ((*(byte *)((long)*ppuVar8 + uVar11 * 2 + 1) & 0x20) != 0) {
      pbVar16[-1] = 0;
      pbVar13 = pbVar16;
      goto LAB_0010536e;
    }
    uVar11 = (ulong)*pbVar16;
    pbVar16 = pbVar16 + 1;
  } while( true );
  pbVar16 = pbVar16 + -1;
  pbVar13 = pbVar16;
LAB_0010536e:
  do {
    pbVar13 = pbVar13 + 1;
    bVar3 = *pbVar16;
    if ((ulong)bVar3 == 0) goto LAB_0010530a;
    bVar12 = bVar3;
    if ((*(byte *)((long)*ppuVar8 + (ulong)bVar3 * 2 + 1) & 0x20) == 0) break;
    pbVar16 = pbVar16 + 1;
  } while( true );
LAB_0010538c:
  if (bVar12 == 0) goto LAB_001053a2;
  if ((*(byte *)((long)*ppuVar8 + (ulong)bVar12 * 2 + 1) & 0x20) != 0) {
    pbVar13[-1] = 0;
    goto LAB_001053b3;
  }
  bVar12 = *pbVar13;
  pbVar13 = pbVar13 + 1;
  goto LAB_0010538c;
LAB_001053a2:
  if (bVar3 != 0x2d) {
    pbVar13 = pbVar13 + -1;
LAB_001053b3:
    do {
      if ((ulong)*pbVar13 == 0) goto LAB_001053cb;
      if ((*(byte *)((long)*ppuVar8 + (ulong)*pbVar13 * 2 + 1) & 0x20) == 0) {
        if (*pbVar16 != 0x2d) goto LAB_001053fe;
        bVar3 = pbVar16[1];
        pbVar14 = pbVar16 + 2;
        if (bVar3 == 0x2d) goto LAB_001054d2;
        if (pbVar16[2] != 0) goto LAB_001053fe;
        goto LAB_001054ce;
      }
      pbVar13 = pbVar13 + 1;
    } while( true );
  }
LAB_0010530a:
  free(b_1);
  pbVar7 = local_a8;
  pbVar16 = local_b0;
LAB_0010531e:
  __ptr = __ptr + 1;
  goto LAB_001051e5;
LAB_001053cb:
  if (*pbVar16 != 0x2d) {
LAB_001053fe:
    iVar4 = poptReadFile((char *)pbVar16,&b_1,&nb_1,1);
    pcVar10 = b_1;
    sVar1 = nb_1;
    if ((iVar4 == 0) && (nb_1 != 0 && b_1 != (char *)0x0)) {
      pbVar14 = (byte *)b_1;
      if (*pbVar13 != 0) {
        sVar9 = strlen((char *)pbVar13);
        pbVar14 = (byte *)realloc(pcVar10,sVar9 + sVar1 + 1);
        sVar1 = nb_1;
        b_1 = (char *)pbVar14;
        if (pbVar14 == (byte *)0x0) goto LAB_0010530a;
        (pbVar14 + (nb_1 - 1))[0] = 0x20;
        (pbVar14 + (nb_1 - 1))[1] = 0;
        strcpy((char *)(pbVar14 + nb_1),(char *)pbVar13);
        nb_1 = sVar9 + 1 + sVar1;
      }
      pbVar13 = pbVar14;
      pcVar10 = strrchr((char *)pbVar16,0x2f);
      pbVar14 = (byte *)(pcVar10 + 1);
      if (pcVar10 == (char *)0x0) {
        pbVar14 = pbVar16;
      }
      if (pbVar14[1] == 0) {
        bVar3 = *pbVar14;
LAB_001054ce:
        local_88.option.shortName = bVar3;
        pbVar14 = (byte *)local_88.option.longName;
      }
LAB_001054d2:
      local_88.option.longName = (char *)pbVar14;
      iVar4 = poptParseArgvString((char *)pbVar13,&local_88.argc,&local_88.argv);
      if (iVar4 == 0) {
        local_88.option.argInfo = 0x40000000;
        uVar11 = 0;
        local_a0 = local_88._48_8_ & 0xffffffff;
        if (local_88.argc < 1) {
          local_a0 = uVar11;
        }
        local_d0 = 0;
        uVar15 = 0;
        for (; ppcVar2 = local_88.argv, local_a0 != uVar11; uVar11 = uVar11 + 1) {
          pcVar10 = local_88.argv[uVar11];
          iVar4 = strncmp(pcVar10,"--POPTdesc=",0xb);
          if (iVar4 == 0) {
            local_88.option.descrip = pcVar10 + 0xc;
            if ((pcVar10[0xc] == '$') && (pcVar10[0xd] == '\"')) {
              local_88.option.descrip = pcVar10 + 0xd;
            }
            local_d0 = local_d0 & 0xbfffffff;
LAB_001055f8:
            local_88.option.argInfo = local_d0;
            uVar15 = uVar15 - 1;
          }
          else {
            iVar4 = strncmp(pcVar10,"--POPTargs=",0xb);
            if (iVar4 == 0) {
              local_88.option.argDescrip = pcVar10 + 0xc;
              if ((pcVar10[0xc] == '$') && (pcVar10[0xd] == '\"')) {
                local_88.option.argDescrip = pcVar10 + 0xd;
              }
              local_d0 = (local_d0 & 0xbffffffe) + 1;
              goto LAB_001055f8;
            }
            if (uVar11 != uVar15) {
              ppcVar2[(int)uVar15] = pcVar10;
            }
          }
          uVar15 = uVar15 + 1;
        }
        if (uVar15 != (uint)local_a0) {
          local_88.argv[(int)uVar15] = (char *)0x0;
          local_88.argc = uVar15;
        }
        iVar4 = strcmp((char *)pbVar7,"alias");
        if (iVar4 == 0) {
          iVar4 = 0;
        }
        else {
          iVar5 = strcmp((char *)pbVar7,"exec");
          iVar4 = 1;
          if (iVar5 != 0) goto LAB_0010530a;
        }
        poptAddItem(local_98,&local_88,iVar4);
      }
    }
  }
  goto LAB_0010530a;
}

Assistant:

int poptReadConfigFile(poptContext con, const char * fn)
{
    char * b = NULL, *be;
    size_t nb = 0;
    const char *se;
    char *t = NULL, *te;
    int rc;

    if ((rc = poptReadFile(fn, &b, &nb, POPT_READFILE_TRIMNEWLINES)) != 0)
	return (errno == ENOENT ? 0 : rc);
    if (b == NULL || nb == 0) {
	rc = POPT_ERROR_BADCONFIG;
	goto exit;
    }

    if ((t = malloc(nb + 1)) == NULL)
	goto exit;
    te = t;

    be = (b + nb);
    for (se = b; se < be; se++) {
	switch (*se) {
	  case '\n':
	    *te = '\0';
	    te = t;
	    while (*te && _isspaceptr(te)) te++;
	    if (*te && *te != '#')
		if ((rc = poptConfigLine(con, te)) != 0)
		    goto exit;
	    break;
	  case '\\':
	    *te = *se++;
	    /* \ at the end of a line does not insert a \n */
	    if (se < be && *se != '\n') {
		te++;
		*te++ = *se;
	    }
	    break;
	  default:
	    *te++ = *se;
	    break;
	}
    }
    rc = 0;

exit:
    free(t);
    if (b)
	free(b);
    return rc;
}